

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hpp
# Opt level: O3

ostream * pg::operator<<(ostream *out,_label_vertex *lv)

{
  string *psVar1;
  ostream *this;
  size_type sVar2;
  long lVar3;
  char *pcVar4;
  
  lVar3 = (long)lv->v;
  if ((lVar3 < 0) || (lv->g->n_vertices <= lVar3)) {
    pcVar4 = "<N/A>";
    sVar2 = 5;
  }
  else {
    psVar1 = lv->g->_label[lVar3];
    if ((psVar1 == (string *)0x0) || (sVar2 = psVar1->_M_string_length, sVar2 == 0)) {
      this = (ostream *)std::ostream::operator<<(out,lv->v);
      std::__ostream_insert<char,std::char_traits<char>>(this,"/",1);
      std::ostream::operator<<(this,lv->g->_priority[lv->v]);
      return out;
    }
    pcVar4 = (psVar1->_M_dataplus)._M_p;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,sVar2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const _label_vertex &lv) {
            if (lv.v < 0 or lv.v >= lv.g.nodecount()) {
                out << "<N/A>";
            } else {
                std::string* l = lv.g.rawlabel(lv.v);
                if (l == nullptr or l->empty()) out << lv.v << "/" << lv.g.priority(lv.v);
                else out << *l;
            }
            return out;
        }